

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_t.cpp
# Opt level: O2

value_t * __thiscall deci::vm_t::Run(vm_t *this,value_t *value)

{
  int iVar1;
  value_t *pvVar2;
  runtime_error *this_00;
  stack_t local;
  
  iVar1 = (*value->_vptr_value_t[1])(value);
  if (iVar1 == 4) {
    stack_t::stack_t(&local);
    (*value->_vptr_value_t[7])(value,this,this,&local);
    stack_t::MergeVariable(&this->dataStack,&local);
    pvVar2 = stack_t::ReleaseResult(&local);
    stack_t::~stack_t(&local);
    return pvVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unknown value type to run");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

value_t* vm_t::Run(value_t& value) {
    switch (value.Type())
    {
    case value_t::FUNCTION: {
      stack_t local;
      function_t& func = static_cast<function_t&>(value);
      func.Evaluate(*this, this->dataStack, local);
      this->dataStack.MergeVariable(local);
      return local.ReleaseResult();
    }
    default:
      throw std::runtime_error("Unknown value type to run");
    }
  }